

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Moira.cpp
# Opt level: O0

void __thiscall moira::Moira::Moira(Moira *this)

{
  ExecPtr *pEVar1;
  InstrInfo *pIVar2;
  DasmPtr *pDVar3;
  undefined5 uStack_4d;
  undefined4 uStack_44;
  undefined5 uStack_2d;
  undefined4 uStack_24;
  Moira *this_local;
  
  this->_vptr_Moira = (_func_int **)&PTR__Moira_006311f0;
  this->cpuModel = M68000;
  this->dasmModel = M68000;
  Debugger::Debugger(&this->debugger,this);
  this->clock = 0;
  (this->reg).pc = 0;
  (this->reg).pc0 = 0;
  (this->reg).sr.t1 = false;
  (this->reg).sr.t0 = false;
  (this->reg).sr.s = false;
  (this->reg).sr.m = false;
  (this->reg).sr.x = false;
  (this->reg).sr.n = false;
  (this->reg).sr.z = false;
  (this->reg).sr.v = false;
  (this->reg).sr.c = false;
  (this->reg).sr.ipl = '\0';
  *(undefined8 *)((long)&(this->reg).field_3 + 0x30) = 0;
  *(undefined8 *)((long)&(this->reg).field_3 + 0x38) = 0;
  *(undefined8 *)((long)&(this->reg).field_3 + 0x20) = 0;
  *(undefined8 *)((long)&(this->reg).field_3 + 0x28) = 0;
  *(undefined8 *)((long)&(this->reg).field_3 + 0x10) = 0;
  *(undefined8 *)((long)&(this->reg).field_3 + 0x18) = 0;
  *(undefined8 *)&(this->reg).field_3 = 0;
  *(undefined8 *)((long)&(this->reg).field_3 + 8) = 0;
  (this->reg).usp = 0;
  (this->reg).isp = 0;
  (this->reg).msp = 0;
  (this->reg).ipl = '\0';
  (this->reg).vbr = 0;
  (this->reg).sfc = 0;
  (this->reg).dfc = 0;
  (this->reg).cacr = 0;
  (this->reg).caar = 0;
  (this->queue).irc = 0;
  (this->queue).ird = 0;
  this->irqMode = AUTO;
  this->ipl = '\0';
  this->fcl = '\x02';
  this->fcSource = '\0';
  this->exception = 0;
  this->cp = 0;
  this->loopModeDelay = 2;
  this->readBuffer = 0;
  this->writeBuffer = 0;
  this->flags = 0;
  this->exec = (ExecPtr *)0x0;
  this->loop = (ExecPtr *)0x0;
  this->dasm = (DasmPtr *)0x0;
  this->info = (InstrInfo *)0x0;
  pEVar1 = (ExecPtr *)operator_new__(0x100000);
  this->exec = pEVar1;
  pEVar1 = (ExecPtr *)operator_new__(0x100000);
  this->loop = pEVar1;
  pIVar2 = (InstrInfo *)operator_new__(0xc0000);
  this->info = pIVar2;
  pDVar3 = (DasmPtr *)operator_new__(0x100000);
  this->dasm = pDVar3;
  createJumpTable(this,this->cpuModel,this->dasmModel);
  (this->instrStyle).syntax = MOIRA;
  (this->instrStyle).letterCase = MIXED_CASE;
  (this->instrStyle).numberFormat.prefix = "$";
  (this->instrStyle).numberFormat.radix = (char)0x10;
  (this->instrStyle).numberFormat.upperCase = (bool)(char)(0x10 >> 8);
  (this->instrStyle).numberFormat.plainZero = (bool)(char)(0x10 >> 0x10);
  *(undefined5 *)&(this->instrStyle).numberFormat.field_0xb = uStack_2d;
  *(ulong *)&(this->instrStyle).tab = CONCAT44(uStack_24,8);
  (this->dataStyle).syntax = MOIRA;
  (this->dataStyle).letterCase = MIXED_CASE;
  (this->dataStyle).numberFormat.prefix = "";
  (this->dataStyle).numberFormat.radix = (char)0x10;
  (this->dataStyle).numberFormat.upperCase = (bool)(char)(0x10 >> 8);
  (this->dataStyle).numberFormat.plainZero = (bool)(char)(0x10 >> 0x10);
  *(undefined5 *)&(this->dataStyle).numberFormat.field_0xb = uStack_4d;
  *(ulong *)&(this->dataStyle).tab = CONCAT44(uStack_44,1);
  return;
}

Assistant:

Moira::Moira()
{
    exec = new ExecPtr[65536];
    loop = new ExecPtr[65536];
    if (MOIRA_BUILD_INSTR_INFO_TABLE) info = new InstrInfo[65536];
    if (MOIRA_ENABLE_DASM) dasm = new DasmPtr[65536];

    createJumpTable(cpuModel, dasmModel);

    instrStyle = DasmStyle {

        .syntax         = Syntax::MOIRA,
        .letterCase     = LetterCase::MIXED_CASE,
        .numberFormat   = { .prefix = "$", .radix = 16, .upperCase = false, .plainZero = false },
        .tab            = 8
    };

    dataStyle = DasmStyle {

        .syntax         = Syntax::MOIRA,
        .letterCase     = LetterCase::MIXED_CASE,
        .numberFormat   = { .prefix = "", .radix = 16, .upperCase = false, .plainZero = false },
        .tab            = 1
    };
}